

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QEventPointPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QEventPointPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QEventPointPrivate *this_00;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QExplicitlySharedDataPointer<QEventPointPrivate> *in_RDI;
  void *in_R8;
  QEventPointPrivate *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x34918b);
  Qt::totally_ordered_wrapper<QEventPointPrivate_*>::operator->
            ((totally_ordered_wrapper<QEventPointPrivate_*> *)0x349195);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x34919d);
  if ((!bVar1) &&
     (this_00 = Qt::totally_ordered_wrapper<QEventPointPrivate_*>::get(&in_RDI->d),
     this_00 != (QEventPointPrivate *)0x0)) {
    QEventPointPrivate::~QEventPointPrivate(this_00);
    operator_delete(this_00,0xe0);
  }
  Qt::totally_ordered_wrapper<QEventPointPrivate_*>::reset
            (&in_RDI->d,(QEventPointPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}